

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O2

void buf_free(buf_t *buf)

{
  uint __line;
  char *__assertion;
  
  if (buf == (buf_t *)0x0) {
    __assertion = "buf != NULL";
    __line = 0x3e;
  }
  else if (buf->size == 0) {
    __assertion = "buf->size > 0";
    __line = 0x3f;
  }
  else {
    if (buf->data != (uchar *)0x0) {
      free(buf->data);
      buf->data = (uchar *)0x0;
      buf->len = 0;
      buf->size = 0;
      return;
    }
    __assertion = "buf->data != NULL";
    __line = 0x40;
  }
  __assert_fail(__assertion,"/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/buf.c",
                __line,"void buf_free(buf_t *)");
}

Assistant:

void buf_free(buf_t *buf) {
  assert(buf != NULL);
  assert(buf->size > 0);
  assert(buf->data != NULL);
  
  free(buf->data);
  buf->size = 0;
  buf->len = 0;
  buf->data = NULL;
}